

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O1

void jpc_pi_destroy(jpc_pi_t *pi)

{
  uint uVar1;
  uint uVar2;
  jpc_picomp_t *pjVar3;
  uint **ppuVar4;
  
  pjVar3 = pi->picomps;
  if (pjVar3 != (jpc_picomp_t *)0x0) {
    if (pi->numcomps != 0) {
      uVar1 = 0;
      do {
        if (pjVar3->pirlvls != (jpc_pirlvl_t *)0x0) {
          if (pjVar3->numrlvls != 0) {
            ppuVar4 = &pjVar3->pirlvls->prclyrnos;
            uVar2 = 0;
            do {
              if (*ppuVar4 != (uint *)0x0) {
                jas_free(*ppuVar4);
              }
              uVar2 = uVar2 + 1;
              ppuVar4 = ppuVar4 + 4;
            } while (uVar2 < pjVar3->numrlvls);
          }
          jas_free(pjVar3->pirlvls);
        }
        uVar1 = uVar1 + 1;
        pjVar3 = pjVar3 + 1;
      } while (uVar1 < pi->numcomps);
    }
    jas_free(pi->picomps);
  }
  if (pi->pchglist != (jpc_pchglist_t *)0x0) {
    jpc_pchglist_destroy(pi->pchglist);
  }
  jas_free(pi);
  return;
}

Assistant:

void jpc_pi_destroy(jpc_pi_t *pi)
{
	jpc_picomp_t *picomp;
	unsigned compno;
	if (pi->picomps) {
		for (compno = 0, picomp = pi->picomps; compno < pi->numcomps;
		  ++compno, ++picomp) {
			jpc_picomp_destroy(picomp);
		}
		jas_free(pi->picomps);
	}
	if (pi->pchglist) {
		jpc_pchglist_destroy(pi->pchglist);
	}
	jas_free(pi);
}